

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::Finalize(idx2_file *Idx2,params *P)

{
  array<idx2::subband> *Subbands;
  undefined8 *puVar1;
  undefined4 *puVar2;
  stack_array<idx2::v3<int>,_16> *psVar3;
  array<idx2::v3<int>_> *Array;
  byte *pbVar4;
  v3<int> *pvVar5;
  v3<int> *pvVar6;
  stack_array<signed_char,_4> *Beg;
  int iVar7;
  int iVar8;
  byte *pbVar9;
  u8 uVar10;
  byte bVar11;
  char cVar12;
  int D;
  int iVar13;
  undefined4 uVar14;
  long lVar15;
  size_t sVar16;
  u64 uVar17;
  long lVar18;
  idx2 *this;
  byte bVar19;
  int Sb;
  uint uVar20;
  int J;
  int iVar21;
  uint uVar22;
  uint uVar23;
  v3i *N3;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  ulong uVar32;
  byte *pbVar33;
  byte bVar34;
  char cVar35;
  int iVar36;
  str Output;
  stack_array<idx2::v3<int>,_16> *Output_00;
  char cVar37;
  uint uVar38;
  long lVar39;
  int *piVar40;
  ulong uVar41;
  int D_1;
  long lVar42;
  ulong uVar43;
  long lVar44;
  array<idx2::v3<int>_> *Elem;
  char *pcVar45;
  long *in_FS_OFFSET;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  stref sVar51;
  error<idx2::idx2_err_code> eVar52;
  v3i N3_00;
  v3i N3_01;
  v3i N3_02;
  char TformOrder [8];
  anon_union_8_2_2df48d06_for_stref_0 local_1e8;
  uint local_1e0;
  v3i F3;
  undefined4 uStack_1cc;
  stack_string<64> FilesOrder;
  stack_string<64> ChunksOrderInFile;
  char BrickOrder [128];
  
  iVar13 = (Idx2->BrickDims3).field_0.field_0.X;
  if (((POPCOUNT(iVar13) == 1) &&
      (iVar27 = (Idx2->BrickDims3).field_0.field_0.Y, POPCOUNT(iVar27) == 1)) &&
     (iVar31 = (Idx2->BrickDims3).field_0.field_0.Z, POPCOUNT(iVar31) == 1)) {
    if ((((Idx2->Dims3).field_0.field_0.X < iVar13) || ((Idx2->Dims3).field_0.field_0.Y < iVar27))
       || ((Idx2->Dims3).field_0.field_0.Z < iVar31)) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x170;
      sVar51 = ToString(BrickSizeTooBig);
      lVar15 = *in_FS_OFFSET;
      iVar13 = snprintf((char *)(lVar15 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)sVar51.Size,sVar51.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                        ,0x170);
      pcVar45 = " total dims: (%d %d %d), brick dims: (%d %d %d)\n";
      snprintf((char *)(lVar15 + -0xf80) + iVar13,0x400 - (long)iVar13,
               " total dims: (%d %d %d), brick dims: (%d %d %d)\n",
               (ulong)(uint)(Idx2->Dims3).field_0.field_0.X,
               (ulong)(uint)(Idx2->Dims3).field_0.field_0.Y,
               (ulong)(uint)(Idx2->Dims3).field_0.field_0.Z,(Idx2->BrickDims3).field_0.field_0.X,
               (Idx2->BrickDims3).field_0.field_0.Y,(Idx2->BrickDims3).field_0.field_0.Z);
      uVar23 = 0x10016;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x171;
      pcVar45 = "";
      uVar23 = 0;
    }
  }
  else {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x16b;
    sVar51 = ToString(BrickSizeNotPowerOfTwo);
    lVar15 = *in_FS_OFFSET;
    iVar13 = snprintf((char *)(lVar15 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                      (ulong)(uint)sVar51.Size,sVar51.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                      ,0x16b);
    pcVar45 = "(%d %d %d)\n";
    snprintf((char *)(lVar15 + -0xf80) + iVar13,0x400 - (long)iVar13,"(%d %d %d)\n",
             (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X,
             (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y);
    uVar23 = 0x10015;
  }
  if ((char)uVar23 == '\0') {
    auVar46._8_8_ = 0;
    auVar46._0_8_ = P->Tolerance;
    auVar48._8_8_ = 0x7fffffffffffffff;
    auVar48._0_8_ = 0x7fffffffffffffff;
    auVar46 = vandpd_avx(auVar46,auVar48);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = Idx2->Tolerance;
    auVar46 = vmaxsd_avx(auVar49,auVar46);
    P->Tolerance = auVar46._0_8_;
    cVar12 = Idx2->NLevels;
    if (cVar12 == '\0') {
      iVar13 = (Idx2->Dims3).field_0.field_0.X;
      cVar12 = '\0';
      iVar27 = (Idx2->BrickDims3).field_0.field_0.Z;
      iVar31 = (Idx2->BrickDims3).field_0.field_0.Y;
      iVar29 = (Idx2->BrickDims3).field_0.field_0.X;
      while (((iVar29 <= iVar13 && (iVar7 = (Idx2->Dims3).field_0.field_0.Y, iVar31 <= iVar7)) &&
             (iVar8 = (Idx2->Dims3).field_0.field_0.Z, iVar27 <= iVar8))) {
        iVar21 = iVar29 * 2;
        if (iVar29 == 1) {
          iVar21 = iVar29;
        }
        iVar25 = iVar31 * 2;
        if (iVar31 == 1) {
          iVar25 = iVar31;
        }
        iVar36 = iVar27 * 2;
        if (iVar27 == 1) {
          iVar36 = iVar27;
        }
        iVar27 = iVar36;
        iVar31 = iVar25;
        iVar29 = iVar21;
        if (((iVar21 <= iVar13) && (iVar25 <= iVar7)) && (iVar36 <= iVar8)) {
          cVar12 = cVar12 + '\x01';
          Idx2->NLevels = cVar12;
        }
      }
    }
    if (cVar12 < '\x11') {
      if ((Idx2->BitPlanesPerFile < Idx2->BitPlanesPerChunk) ||
         (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk != 0)) {
        *(char **)(*in_FS_OFFSET + -0xb80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x2e0;
        sVar51 = ToString(SizeMismatched);
        lVar15 = *in_FS_OFFSET;
        iVar13 = snprintf((char *)(lVar15 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)sVar51.Size,sVar51.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                          ,0x2e0);
        pcVar45 = "BitPlanesPerFile not multiple of BitPlanesPerChunk\n";
        snprintf((char *)(lVar15 + -0xf80) + iVar13,0x400 - (long)iVar13,
                 "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");
        uVar43 = 0x10004;
      }
      else {
        TformOrder[0] = '\0';
        TformOrder[1] = '\0';
        TformOrder[2] = '\0';
        TformOrder[3] = '\0';
        TformOrder[4] = '\0';
        TformOrder[5] = '\0';
        TformOrder[6] = '\0';
        TformOrder[7] = '\0';
        N3 = &Idx2->BrickDims3;
        lVar15 = 0;
        iVar13 = 0;
        while( true ) {
          if (lVar15 == 3) break;
          if (1 < (N3->field_0).E[lVar15]) {
            TformOrder[iVar13] = (char)lVar15 + 'X';
            iVar13 = iVar13 + 1;
          }
          lVar15 = lVar15 + 1;
        }
        (TformOrder + iVar13)[0] = '+';
        (TformOrder + iVar13)[1] = '+';
        BrickOrder._0_8_ = TformOrder;
        sVar16 = strlen(TformOrder);
        uVar14 = (undefined4)sVar16;
        BrickOrder[8] = (char)uVar14;
        BrickOrder[9] = (char)((uint)uVar14 >> 8);
        BrickOrder[10] = (char)((uint)uVar14 >> 0x10);
        BrickOrder[0xb] = (char)((uint)uVar14 >> 0x18);
        uVar17 = EncodeTransformOrder((stref *)BrickOrder);
        Idx2->TransformOrder = uVar17;
        iVar27 = 1;
        uVar10 = DecodeTransformOrder(uVar17,1,(Idx2->TransformOrderFull).Data);
        (Idx2->TransformOrderFull).Len = uVar10;
        iVar13 = (Idx2->BrickDims3).field_0.field_0.Z;
        auVar50._8_4_ = 1;
        auVar50._0_8_ = 0x100000001;
        auVar50._12_4_ = 1;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = (Idx2->BrickDims3).field_0.field_3.XY.field_0;
        auVar46 = vpcmpgtd_avx(auVar47,auVar50);
        auVar46 = vpsubd_avx(auVar47,auVar46);
        (Idx2->BrickDimsExt3).field_0.field_3.XY.field_0 = auVar46._0_8_;
        (Idx2->BrickDimsExt3).field_0.field_0.Z = (uint)(1 < iVar13) + iVar13;
        Subbands = &Idx2->Subbands;
        BuildSubbands(&Idx2->BrickDimsExt3,1,Idx2->TransformOrder,Subbands);
        BuildSubbands(N3,1,Idx2->TransformOrder,&Idx2->SubbandsNonExt);
        iVar13 = 1 << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 8) & 0x1f);
        FilesOrder.Data._0_8_ =
             (1L << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 4) & 0x3f)) << 0x20 |
             1L << ((ulong)*(byte *)&(P->DownsamplingFactor3).field_0 & 0x3f);
        FilesOrder.Data[8] = (char)iVar13;
        FilesOrder.Data[9] = (char)((uint)iVar13 >> 8);
        FilesOrder.Data[10] = (char)((uint)iVar13 >> 0x10);
        FilesOrder.Data[0xb] = (char)((uint)iVar13 >> 0x18);
        Mallocator();
        Mallocator();
        BrickOrder[0] = '\0';
        BrickOrder[1] = '\0';
        BrickOrder[2] = '\0';
        BrickOrder[3] = '\0';
        BrickOrder[4] = '\0';
        BrickOrder[5] = '\0';
        BrickOrder[6] = '\0';
        BrickOrder[7] = '\0';
        BrickOrder[8] = '\0';
        BrickOrder[9] = '\0';
        BrickOrder[10] = '\0';
        BrickOrder[0xb] = '\0';
        BrickOrder[0xc] = '\0';
        BrickOrder[0xd] = '\0';
        BrickOrder[0xe] = '\0';
        BrickOrder[0xf] = '\0';
        BrickOrder._16_8_ = &Mallocator::Instance;
        BrickOrder[0x18] = '\0';
        BrickOrder[0x19] = '\0';
        BrickOrder[0x1a] = '\0';
        BrickOrder[0x1b] = '\0';
        BrickOrder[0x1c] = '\0';
        BrickOrder[0x1d] = '\0';
        BrickOrder[0x1e] = '\0';
        BrickOrder[0x1f] = '\0';
        BrickOrder[0x20] = '\0';
        BrickOrder[0x21] = '\0';
        BrickOrder[0x22] = '\0';
        BrickOrder[0x23] = '\0';
        BrickOrder[0x24] = '\0';
        BrickOrder[0x25] = '\0';
        BrickOrder[0x26] = '\0';
        BrickOrder[0x27] = '\0';
        BrickOrder._40_8_ = &Mallocator::Instance;
        Mallocator();
        Mallocator();
        ChunksOrderInFile.Data[0] = '\0';
        ChunksOrderInFile.Data[1] = '\0';
        ChunksOrderInFile.Data[2] = '\0';
        ChunksOrderInFile.Data[3] = '\0';
        ChunksOrderInFile.Data[4] = '\0';
        ChunksOrderInFile.Data[5] = '\0';
        ChunksOrderInFile.Data[6] = '\0';
        ChunksOrderInFile.Data[7] = '\0';
        ChunksOrderInFile.Data[8] = '\0';
        ChunksOrderInFile.Data[9] = '\0';
        ChunksOrderInFile.Data[10] = '\0';
        ChunksOrderInFile.Data[0xb] = '\0';
        ChunksOrderInFile.Data[0xc] = '\0';
        ChunksOrderInFile.Data[0xd] = '\0';
        ChunksOrderInFile.Data[0xe] = '\0';
        ChunksOrderInFile.Data[0xf] = '\0';
        ChunksOrderInFile.Data._16_8_ = &Mallocator::Instance;
        ChunksOrderInFile.Data[0x18] = '\0';
        ChunksOrderInFile.Data[0x19] = '\0';
        ChunksOrderInFile.Data[0x1a] = '\0';
        ChunksOrderInFile.Data[0x1b] = '\0';
        ChunksOrderInFile.Data[0x1c] = '\0';
        ChunksOrderInFile.Data[0x1d] = '\0';
        ChunksOrderInFile.Data[0x1e] = '\0';
        ChunksOrderInFile.Data[0x1f] = '\0';
        ChunksOrderInFile.Data[0x20] = '\0';
        ChunksOrderInFile.Data[0x21] = '\0';
        ChunksOrderInFile.Data[0x22] = '\0';
        ChunksOrderInFile.Data[0x23] = '\0';
        ChunksOrderInFile.Data[0x24] = '\0';
        ChunksOrderInFile.Data[0x25] = '\0';
        ChunksOrderInFile.Data[0x26] = '\0';
        ChunksOrderInFile.Data[0x27] = '\0';
        ChunksOrderInFile.Data._40_8_ = &Mallocator::Instance;
        Resize<idx2::array<idx2::v3<int>>>
                  ((array<idx2::array<idx2::v3<int>_>_> *)BrickOrder,(long)Idx2->NLevels);
        Resize<idx2::array<idx2::v3<int>>>
                  ((array<idx2::array<idx2::v3<int>_>_> *)&ChunksOrderInFile,(long)Idx2->NLevels);
        lVar15 = ChunksOrderInFile.Data._0_8_;
        uVar43 = 0;
        while (lVar44 = lVar15, uVar43 != (uint)(int)Idx2->NLevels) {
          lVar44 = uVar43 * 0x30;
          Resize<idx2::v3<int>>((array<idx2::v3<int>_> *)(lVar15 + lVar44),(Idx2->Subbands).Size);
          Resize<idx2::v3<int>>
                    ((array<idx2::v3<int>_> *)(BrickOrder._0_8_ + lVar44),(Idx2->Subbands).Size);
          if (uVar43 == 0x10) {
            pcVar45 = 
            "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
            ;
            goto LAB_00153000;
          }
          Array = (Idx2->DecodeSubbandSpacings).Arr + uVar43;
          Resize<idx2::v3<int>>(Array,(Idx2->Subbands).Size);
          bVar34 = 0xff;
          lVar39 = 0;
          for (lVar15 = 0; *(long *)(ChunksOrderInFile.Data._0_8_ + 0x18 + lVar44) != lVar15;
              lVar15 = lVar15 + 1) {
            iVar13 = iVar27;
            iVar31 = iVar27;
            iVar29 = iVar27;
            if (uVar43 != 0) {
              piVar40 = *(int **)(ChunksOrderInFile.Data._0_8_ + -0x30 + lVar44);
              iVar13 = *piVar40;
              iVar31 = piVar40[1];
              iVar29 = piVar40[2];
            }
            lVar42 = *(long *)((Subbands->Buffer).Data + lVar15 * 0x40);
            iVar29 = (int)(lVar42 * 2 >> 0x2b) * iVar29;
            F3.field_0._4_4_ = (int)((lVar42 << 0x16) >> 0x2b) * iVar31;
            F3.field_0._0_4_ = (int)((lVar42 << 0x2b) >> 0x2b) * iVar13;
            lVar42 = *(long *)(BrickOrder._0_8_ + lVar44);
            lVar18 = lVar15 * 0xc;
            *(undefined8 *)(lVar42 + lVar18) = F3.field_0.field_3.XY.field_0;
            *(int *)(lVar42 + 8 + lVar18) = iVar29;
            F3.field_0._8_4_ = iVar29;
            iVar13 = iVar27;
            iVar31 = iVar27;
            iVar29 = iVar27;
            if (uVar43 != 0) {
              piVar40 = *(int **)(ChunksOrderInFile.Data._0_8_ + -0x30 + lVar44);
              iVar13 = *piVar40;
              iVar31 = piVar40[1];
              iVar29 = piVar40[2];
            }
            lVar42 = *(long *)((Subbands->Buffer).Data + lVar15 * 0x40 + 0x10);
            local_1e0 = (int)(lVar42 * 2 >> 0x2b) * iVar29;
            local_1e8._4_4_ = (int)((lVar42 << 0x16) >> 0x2b) * iVar31;
            local_1e8._0_4_ = (int)((lVar42 << 0x2b) >> 0x2b) * iVar13;
            lVar42 = *(long *)(ChunksOrderInFile.Data._0_8_ + lVar44);
            *(anon_union_8_2_2df48d06_for_stref_0 *)(lVar42 + lVar18) = local_1e8;
            *(uint *)(lVar42 + 8 + lVar18) = local_1e0;
            pbVar9 = (Array->Buffer).Data;
            pbVar4 = pbVar9 + lVar18;
            pbVar4[0] = '\x01';
            pbVar4[1] = '\0';
            pbVar4[2] = '\0';
            pbVar4[3] = '\0';
            pbVar4[4] = '\x01';
            pbVar4[5] = '\0';
            pbVar4[6] = '\0';
            pbVar4[7] = '\0';
            pbVar9 = pbVar9 + lVar18 + 8;
            pbVar9[0] = '\x01';
            pbVar9[1] = '\0';
            pbVar9[2] = '\0';
            pbVar9[3] = '\0';
            for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
              iVar13 = *(int *)(FilesOrder.Data + lVar42 * 4);
              if (F3.field_0.E[lVar42] % iVar13 == 0) {
                iVar31 = *(int *)((long)&local_1e8 + lVar42 * 4);
                if (iVar31 % iVar13 != 0) {
                  *(int *)((Array->Buffer).Data + lVar42 * 4 + lVar39) = iVar13 / iVar31;
                }
              }
              else {
                bVar34 = bVar34 & ~(byte)(1L << ((byte)lVar15 & 0x3f));
              }
            }
            lVar39 = lVar39 + 0xc;
          }
          bVar19 = bVar34;
          if (bVar34 == 1) {
            bVar19 = 0;
          }
          if ((long)Idx2->NLevels <= (long)(uVar43 + 1)) {
            bVar19 = bVar34;
          }
          (Idx2->DecodeSubbandMasks).Arr[uVar43] = bVar19;
          lVar15 = ChunksOrderInFile.Data._0_8_;
          uVar43 = uVar43 + 1;
        }
        for (; lVar44 != ChunksOrderInFile.Data._24_8_ * 0x30 + lVar15; lVar44 = lVar44 + 0x30) {
          (**(code **)(**(long **)(lVar44 + 0x28) + 8))(*(long **)(lVar44 + 0x28),lVar44);
          *(undefined1 (*) [16])(lVar44 + 0x18) = (undefined1  [16])0x0;
          lVar15 = ChunksOrderInFile.Data._0_8_;
        }
        (**(code **)(*(long *)ChunksOrderInFile.Data._40_8_ + 8))();
        ChunksOrderInFile.Data[0x18] = '\0';
        ChunksOrderInFile.Data[0x19] = '\0';
        ChunksOrderInFile.Data[0x1a] = '\0';
        ChunksOrderInFile.Data[0x1b] = '\0';
        ChunksOrderInFile.Data[0x1c] = '\0';
        ChunksOrderInFile.Data[0x1d] = '\0';
        ChunksOrderInFile.Data[0x1e] = '\0';
        ChunksOrderInFile.Data[0x1f] = '\0';
        ChunksOrderInFile.Data[0x20] = '\0';
        ChunksOrderInFile.Data[0x21] = '\0';
        ChunksOrderInFile.Data[0x22] = '\0';
        ChunksOrderInFile.Data[0x23] = '\0';
        ChunksOrderInFile.Data[0x24] = '\0';
        ChunksOrderInFile.Data[0x25] = '\0';
        ChunksOrderInFile.Data[0x26] = '\0';
        ChunksOrderInFile.Data[0x27] = '\0';
        for (lVar15 = BrickOrder._0_8_; lVar15 != BrickOrder._24_8_ * 0x30 + BrickOrder._0_8_;
            lVar15 = lVar15 + 0x30) {
          (**(code **)(**(long **)(lVar15 + 0x28) + 8))(*(long **)(lVar15 + 0x28),lVar15);
          *(undefined1 (*) [16])(lVar15 + 0x18) = (undefined1  [16])0x0;
        }
        (**(code **)(*(long *)BrickOrder._40_8_ + 8))();
        lVar15 = *(long *)((Idx2->SubbandsNonExt).Buffer.Data + 8);
        iVar13 = (Idx2->BrickDims3).field_0.field_0.X;
        iVar27 = (Idx2->BrickDims3).field_0.field_0.Y;
        iVar31 = (Idx2->BrickDims3).field_0.field_0.Z;
        (Idx2->GroupBrick3).field_0.field_3.XY.field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)
             ((long)iVar27 / (long)(int)((lVar15 << 0x16) >> 0x2b) << 0x20 |
             (long)iVar13 / (long)(((int)lVar15 << 0xb) >> 0xb) & 0xffffffffU);
        (Idx2->GroupBrick3).field_0.field_0.Z = iVar31 / (int)(lVar15 * 2 >> 0x2b);
        uVar43 = (long)(iVar13 + -1 + (Idx2->Dims3).field_0.field_0.X) / (long)iVar13;
        lVar15 = (long)(iVar27 + (Idx2->Dims3).field_0.field_0.Y + -1) / (long)iVar27;
        lVar44 = (long)((Idx2->Dims3).field_0.field_0.Z + iVar31 + -1) / (long)iVar31;
        piVar40 = &(Idx2->NBricks3).Arr[0].field_0.field_0.Z;
        uVar41 = 0;
        while( true ) {
          if (uVar41 == ((long)Idx2->NLevels & 0xffffffffU)) break;
          if (uVar41 == 0x10) goto LAB_00152fbd;
          uVar28 = uVar43 & 0xffffffff | lVar15 << 0x20;
          ((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)(piVar40 + -2))
          ->X = (int)uVar28;
          ((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)(piVar40 + -2))
          ->Y = (int)(uVar28 >> 0x20);
          *piVar40 = (int)lVar44;
          iVar13 = (Idx2->GroupBrick3).field_0.field_0.X;
          iVar27 = (Idx2->GroupBrick3).field_0.field_0.Y;
          iVar31 = (Idx2->GroupBrick3).field_0.field_0.Z;
          uVar43 = (long)((int)uVar43 + -1 + iVar13) / (long)iVar13;
          lVar15 = (long)((int)lVar15 + -1 + iVar27) / (long)iVar27;
          lVar44 = (long)((int)lVar44 + iVar31 + -1) / (long)iVar31;
          uVar41 = uVar41 + 1;
          piVar40 = piVar40 + 3;
        }
        Resize<idx2::stack_string<128>>(&Idx2->BricksOrderStr,(long)Idx2->NLevels);
        for (uVar43 = 0; uVar41 = (ulong)Idx2->NLevels, uVar43 != (uVar41 & 0xffffffff);
            uVar43 = uVar43 + 1) {
          if (uVar43 == 0x10) goto LAB_00152fbd;
          uVar41 = *(ulong *)&(Idx2->NBricks3).Arr[uVar43].field_0;
          uVar28 = (ulong)(int)uVar41;
          lVar15 = 0x3f;
          if (uVar28 != 0) {
            for (; uVar28 >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          lVar44 = 0;
          bVar34 = -((uVar41 & 0xffffffff) == 0) | (byte)lVar15;
          uVar32 = (long)uVar41 >> 0x20;
          lVar15 = 0x3f;
          if (uVar32 != 0) {
            for (; uVar32 >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          bVar19 = -(uVar41 >> 0x20 == 0) | (byte)lVar15;
          uVar23 = (Idx2->NBricks3).Arr[uVar43].field_0.field_0.Z;
          uVar24 = (ulong)(int)uVar23;
          uVar22 = (uint)(char)((1L << (bVar34 & 0x3f) != uVar28) + bVar34);
          lVar15 = 0x3f;
          if (uVar24 != 0) {
            for (; uVar24 >> lVar15 == 0; lVar15 = lVar15 + -1) {
            }
          }
          bVar34 = -(uVar24 == 0) | (byte)lVar15;
          uVar26 = (uint)(char)((1L << (bVar19 & 0x3f) != uVar32) + bVar19);
          uVar20 = uVar26;
          if ((int)uVar22 < (int)uVar26) {
            uVar20 = uVar22;
          }
          uVar30 = (uint)(char)((1L << (bVar34 & 0x3f) != uVar24) + bVar34);
          if ((int)uVar30 <= (int)uVar20) {
            uVar20 = uVar30;
          }
          Output = (str)0x0;
          if (1 < (Idx2->BrickDims3).field_0.field_0.X) {
            Output = (str)(ulong)uVar20;
          }
          uVar38 = 0;
          if (1 < (Idx2->BrickDims3).field_0.field_0.Y) {
            uVar38 = uVar20;
          }
          if ((Idx2->BrickDims3).field_0.field_0.Z < 2) {
            uVar20 = 0;
          }
          iVar13 = uVar22 - (int)Output;
          iVar27 = uVar26 - uVar38;
          FilesOrder.Data[0] = (char)iVar13;
          FilesOrder.Data[1] = (char)((uint)iVar13 >> 8);
          FilesOrder.Data[2] = (char)((uint)iVar13 >> 0x10);
          FilesOrder.Data[3] = (char)((uint)iVar13 >> 0x18);
          FilesOrder.Data[4] = (char)iVar27;
          FilesOrder.Data[5] = (char)((uint)iVar27 >> 8);
          FilesOrder.Data[6] = (char)((uint)iVar27 >> 0x10);
          FilesOrder.Data[7] = (char)((uint)iVar27 >> 0x18);
          FilesOrder.Data._8_4_ = uVar30 - uVar20;
          uVar22 = 0;
          for (; lVar44 != 3; lVar44 = lVar44 + 1) {
            if ((N3->field_0).E[lVar44] == 1) {
              pbVar33 = (byte *)(BrickOrder + (int)uVar22);
              uVar20 = *(uint *)(FilesOrder.Data + lVar44 * 4);
              for (uVar26 = uVar20; Output = (str)(ulong)uVar26, 0 < (int)uVar26;
                  uVar26 = uVar26 - 1) {
                *pbVar33 = (byte)lVar44 | 0x58;
                uVar22 = uVar22 + 1;
                pbVar33 = pbVar33 + 1;
              }
              *(uint *)(FilesOrder.Data + lVar44 * 4) = ((int)uVar20 >> 0x1f & uVar20) - 1;
            }
          }
          while (((0 < (int)FilesOrder.Data._0_4_ || (0 < (int)FilesOrder.Data._4_4_)) ||
                 (0 < (int)FilesOrder.Data._8_4_))) {
            for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
              iVar13 = *(int *)(FilesOrder.Data + lVar15 * 4);
              *(int *)(FilesOrder.Data + lVar15 * 4) = iVar13 + -1;
              if (0 < iVar13) {
                lVar44 = (long)(int)uVar22;
                uVar22 = uVar22 + 1;
                BrickOrder[lVar44] = (char)lVar15 + 'X';
              }
            }
          }
          if (0 < (int)uVar22) {
            uVar28 = (ulong)uVar22;
            uVar22 = uVar22 + 1;
            BrickOrder[uVar28] = '+';
          }
          for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
            BrickOrder[lVar15 + (int)uVar22] = TformOrder[lVar15];
          }
          ChunksOrderInFile.Data._0_8_ = BrickOrder;
          sVar16 = strlen(BrickOrder);
          uVar14 = (undefined4)sVar16;
          ChunksOrderInFile.Data[8] = (char)uVar14;
          ChunksOrderInFile.Data[9] = (char)((uint)uVar14 >> 8);
          ChunksOrderInFile.Data[10] = (char)((uint)uVar14 >> 0x10);
          ChunksOrderInFile.Data[0xb] = (char)((uint)uVar14 >> 0x18);
          this = (idx2 *)EncodeTransformOrder((stref *)&ChunksOrderInFile);
          (Idx2->BricksOrder).Arr[uVar43] = (unsigned_long)this;
          N3_00.field_0.field_0.Y = 0;
          N3_00.field_0.field_0.X = uVar23;
          N3_00.field_0._8_4_ = SUB84((Idx2->BricksOrderStr).Buffer.Data + uVar43 * 0x81,0);
          bVar34 = DecodeTransformOrder(this,uVar41,N3_00,Output);
          (Idx2->BricksOrderStr).Buffer.Data[uVar43 * 0x81 + 0x80] = bVar34;
          if (bVar34 < (Idx2->TransformOrderFull).Len) {
            lVar15 = *in_FS_OFFSET;
            *(char **)(lVar15 + -0xb80) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
            ;
            *(undefined8 *)(*in_FS_OFFSET + -0x980) = 0x2ea00000205;
            *(char **)(lVar15 + -0xb78) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
            ;
            uVar43 = 0x117;
            goto LAB_00152c0d;
          }
        }
        lVar15 = *in_FS_OFFSET;
        puVar1 = (undefined8 *)(lVar15 + -0xb80);
        *puVar1 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
        ;
        lVar44 = *in_FS_OFFSET;
        puVar2 = (undefined4 *)(lVar44 + -0x980);
        *puVar2 = 0x208;
        iVar13 = Idx2->BricksPerChunkIn;
        iVar27 = Idx2->ChunksPerFileIn;
        (Idx2->BricksPerChunk).Arr[0] = iVar13;
        (Idx2->ChunksPerFile).Arr[0] = iVar27;
        pcVar45 = "";
        if (iVar13 < 0x8001) {
          if (POPCOUNT(iVar13) == 1) {
            if (iVar27 < 0x132b) {
              if (POPCOUNT(iVar27) == 1) {
                psVar3 = &Idx2->NFiles3;
                for (uVar43 = 0; uVar43 != (uint)(int)(char)uVar41; uVar43 = uVar43 + 1) {
                  BrickOrder[0x28] = '\0';
                  BrickOrder[0x29] = '\0';
                  BrickOrder[0x2a] = '\0';
                  BrickOrder[0x2b] = '\0';
                  BrickOrder[0x2c] = '\0';
                  BrickOrder[0x2d] = '\0';
                  BrickOrder[0x2e] = '\0';
                  BrickOrder[0x2f] = '\0';
                  BrickOrder[0x30] = '\0';
                  BrickOrder[0x31] = '\0';
                  BrickOrder[0x32] = '\0';
                  BrickOrder[0x33] = '\0';
                  BrickOrder[0x34] = '\0';
                  BrickOrder[0x35] = '\0';
                  BrickOrder[0x36] = '\0';
                  BrickOrder[0x37] = '\0';
                  BrickOrder[0x38] = '\0';
                  BrickOrder[0x39] = '\0';
                  BrickOrder[0x3a] = '\0';
                  BrickOrder[0x3b] = '\0';
                  BrickOrder[0x3c] = '\0';
                  BrickOrder[0x3d] = '\0';
                  BrickOrder[0x3e] = '\0';
                  BrickOrder[0x3f] = '\0';
                  BrickOrder._0_16_ = ZEXT816(0);
                  BrickOrder[0x10] = '\0';
                  BrickOrder[0x11] = '\0';
                  BrickOrder[0x12] = '\0';
                  BrickOrder[0x13] = '\0';
                  BrickOrder[0x14] = '\0';
                  BrickOrder[0x15] = '\0';
                  BrickOrder[0x16] = '\0';
                  BrickOrder[0x17] = '\0';
                  BrickOrder._24_16_ = ZEXT816(0);
                  BrickOrder[0x40] = '\0';
                  ChunksOrderInFile.Len = '\0';
                  ChunksOrderInFile.Data[0x28] = '\0';
                  ChunksOrderInFile.Data[0x29] = '\0';
                  ChunksOrderInFile.Data[0x2a] = '\0';
                  ChunksOrderInFile.Data[0x2b] = '\0';
                  ChunksOrderInFile.Data[0x2c] = '\0';
                  ChunksOrderInFile.Data[0x2d] = '\0';
                  ChunksOrderInFile.Data[0x2e] = '\0';
                  ChunksOrderInFile.Data[0x2f] = '\0';
                  ChunksOrderInFile.Data[0x30] = '\0';
                  ChunksOrderInFile.Data[0x31] = '\0';
                  ChunksOrderInFile.Data[0x32] = '\0';
                  ChunksOrderInFile.Data[0x33] = '\0';
                  ChunksOrderInFile.Data[0x34] = '\0';
                  ChunksOrderInFile.Data[0x35] = '\0';
                  ChunksOrderInFile.Data[0x36] = '\0';
                  ChunksOrderInFile.Data[0x37] = '\0';
                  ChunksOrderInFile.Data[0x38] = '\0';
                  ChunksOrderInFile.Data[0x39] = '\0';
                  ChunksOrderInFile.Data[0x3a] = '\0';
                  ChunksOrderInFile.Data[0x3b] = '\0';
                  ChunksOrderInFile.Data[0x3c] = '\0';
                  ChunksOrderInFile.Data[0x3d] = '\0';
                  ChunksOrderInFile.Data[0x3e] = '\0';
                  ChunksOrderInFile.Data[0x3f] = '\0';
                  ChunksOrderInFile.Data._0_16_ = ZEXT816(0);
                  ChunksOrderInFile.Data[0x10] = '\0';
                  ChunksOrderInFile.Data[0x11] = '\0';
                  ChunksOrderInFile.Data[0x12] = '\0';
                  ChunksOrderInFile.Data[0x13] = '\0';
                  ChunksOrderInFile.Data[0x14] = '\0';
                  ChunksOrderInFile.Data[0x15] = '\0';
                  ChunksOrderInFile.Data[0x16] = '\0';
                  ChunksOrderInFile.Data[0x17] = '\0';
                  ChunksOrderInFile.Data._24_16_ = ZEXT816(0);
                  FilesOrder.Len = '\0';
                  FilesOrder.Data[0x20] = '\0';
                  FilesOrder.Data[0x21] = '\0';
                  FilesOrder.Data[0x22] = '\0';
                  FilesOrder.Data[0x23] = '\0';
                  FilesOrder.Data[0x24] = '\0';
                  FilesOrder.Data[0x25] = '\0';
                  FilesOrder.Data[0x26] = '\0';
                  FilesOrder.Data[0x27] = '\0';
                  FilesOrder.Data[0x28] = '\0';
                  FilesOrder.Data[0x29] = '\0';
                  FilesOrder.Data[0x2a] = '\0';
                  FilesOrder.Data[0x2b] = '\0';
                  FilesOrder.Data[0x2c] = '\0';
                  FilesOrder.Data[0x2d] = '\0';
                  FilesOrder.Data[0x2e] = '\0';
                  FilesOrder.Data[0x2f] = '\0';
                  FilesOrder.Data[0x30] = '\0';
                  FilesOrder.Data[0x31] = '\0';
                  FilesOrder.Data[0x32] = '\0';
                  FilesOrder.Data[0x33] = '\0';
                  FilesOrder.Data[0x34] = '\0';
                  FilesOrder.Data[0x35] = '\0';
                  FilesOrder.Data[0x36] = '\0';
                  FilesOrder.Data[0x37] = '\0';
                  FilesOrder.Data[0x38] = '\0';
                  FilesOrder.Data[0x39] = '\0';
                  FilesOrder.Data[0x3a] = '\0';
                  FilesOrder.Data[0x3b] = '\0';
                  FilesOrder.Data[0x3c] = '\0';
                  FilesOrder.Data[0x3d] = '\0';
                  FilesOrder.Data[0x3e] = '\0';
                  FilesOrder.Data[0x3f] = '\0';
                  FilesOrder.Data[0] = '\0';
                  FilesOrder.Data[1] = '\0';
                  FilesOrder.Data[2] = '\0';
                  FilesOrder.Data[3] = '\0';
                  FilesOrder.Data[4] = '\0';
                  FilesOrder.Data[5] = '\0';
                  FilesOrder.Data[6] = '\0';
                  FilesOrder.Data[7] = '\0';
                  FilesOrder.Data[8] = '\0';
                  FilesOrder.Data[9] = '\0';
                  FilesOrder.Data[10] = '\0';
                  FilesOrder.Data[0xb] = '\0';
                  FilesOrder.Data[0xc] = '\0';
                  FilesOrder.Data[0xd] = '\0';
                  FilesOrder.Data[0xe] = '\0';
                  FilesOrder.Data[0xf] = '\0';
                  FilesOrder.Data[0x10] = '\0';
                  FilesOrder.Data[0x11] = '\0';
                  FilesOrder.Data[0x12] = '\0';
                  FilesOrder.Data[0x13] = '\0';
                  FilesOrder.Data[0x14] = '\0';
                  FilesOrder.Data[0x15] = '\0';
                  FilesOrder.Data[0x16] = '\0';
                  FilesOrder.Data[0x17] = '\0';
                  FilesOrder.Data[0x18] = '\0';
                  FilesOrder.Data[0x19] = '\0';
                  FilesOrder.Data[0x1a] = '\0';
                  FilesOrder.Data[0x1b] = '\0';
                  FilesOrder.Data[0x1c] = '\0';
                  FilesOrder.Data[0x1d] = '\0';
                  FilesOrder.Data[0x1e] = '\0';
                  FilesOrder.Data[0x1f] = '\0';
                  if (uVar43 == 0x10) goto LAB_0015302c;
                  lVar42 = uVar43 * 0x81;
                  pbVar4 = (Idx2->BricksOrderStr).Buffer.Data;
                  uVar41 = (ulong)(Idx2->BricksPerChunk).Arr[0];
                  lVar39 = 0x3f;
                  if (uVar41 != 0) {
                    for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  uVar23 = 0;
                  bVar34 = -(uVar41 == 0) | (byte)lVar39;
                  bVar34 = (1L << (bVar34 & 0x3f) != uVar41) + bVar34;
                  if (pbVar4[lVar42 + 0x80] < bVar34) {
                    bVar34 = pbVar4[lVar42 + 0x80];
                  }
                  iVar13 = 1 << (bVar34 & 0x1f);
                  (Idx2->BricksPerChunk).Arr[uVar43] = iVar13;
                  uVar41 = (ulong)iVar13;
                  lVar39 = 0x3f;
                  if (uVar41 != 0) {
                    for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  BrickOrder[0x40] = (1L << ((byte)lVar39 & 0x3f) != uVar41) + (byte)lVar39;
                  pvVar5 = (Idx2->BricksPerChunk3s).Arr + uVar43;
                  (Idx2->BricksPerChunk3s).Arr[uVar43].field_0.field_3.XY.field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)0x100000001;
                  (Idx2->BricksPerChunk3s).Arr[uVar43].field_0.field_0.Z = 1;
                  iVar13 = -1;
                  for (; uVar23 != (byte)BrickOrder[0x40]; uVar23 = uVar23 + 1) {
                    if (0x7f < (int)((uint)pbVar4[lVar42 + 0x80] + iVar13)) goto LAB_00152f79;
                    bVar11 = pbVar4[(int)((uint)pbVar4[lVar42 + 0x80] + iVar13) + lVar42];
                    if (0x5a < (long)(char)bVar11) goto LAB_00152f9b;
                    piVar40 = (int *)((long)pvVar5 + ((long)(char)bVar11 + -0x58) * 4);
                    *piVar40 = *piVar40 << 1;
                    iVar27 = (uint)(byte)BrickOrder[0x40] + iVar13;
                    if (0x3f < iVar27) goto LAB_00152f62;
                    BrickOrder[iVar27] = bVar11;
                    iVar13 = iVar13 + -1;
                  }
                  F3.field_0.field_3.XY.field_0 = (v2<int>)BrickOrder;
                  F3.field_0._8_4_ = uVar23;
                  uVar17 = EncodeTransformOrder((stref *)&F3);
                  (Idx2->BricksOrderInChunk).Arr[uVar43] = uVar17;
                  iVar13 = (pvVar5->field_0).field_0.X;
                  iVar27 = (pvVar5->field_0).field_0.Y;
                  iVar31 = (Idx2->NBricks3).Arr[uVar43].field_0.field_0.Z;
                  iVar29 = (pvVar5->field_0).field_0.Z;
                  (Idx2->NChunks3).Arr[uVar43].field_0.field_3.XY.field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)
                       ((long)((Idx2->NBricks3).Arr[uVar43].field_0.field_0.Y + iVar27 + -1) /
                        (long)iVar27 << 0x20 |
                       (long)((Idx2->NBricks3).Arr[uVar43].field_0.field_0.X + -1 + iVar13) /
                       (long)iVar13 & 0xffffffffU);
                  (Idx2->NChunks3).Arr[uVar43].field_0.field_0.Z = (iVar31 + iVar29 + -1) / iVar29;
                  uVar41 = (ulong)(Idx2->ChunksPerFile).Arr[0];
                  lVar39 = 0x3f;
                  if (uVar41 != 0) {
                    for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  uVar23 = 0;
                  bVar34 = -(uVar41 == 0) | (byte)lVar39;
                  bVar34 = (1L << (bVar34 & 0x3f) != uVar41) + bVar34;
                  pbVar4 = (Idx2->BricksOrderStr).Buffer.Data;
                  if ((byte)(pbVar4[lVar42 + 0x80] - BrickOrder[0x40]) < bVar34) {
                    bVar34 = pbVar4[lVar42 + 0x80] - BrickOrder[0x40];
                  }
                  iVar13 = 1 << (bVar34 & 0x1f);
                  uVar41 = (ulong)iVar13;
                  lVar39 = 0x3f;
                  if (uVar41 != 0) {
                    for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  pvVar5 = (Idx2->NChunks3).Arr + uVar43;
                  (Idx2->ChunksPerFile).Arr[uVar43] = iVar13;
                  ChunksOrderInFile.Len = (1L << ((byte)lVar39 & 0x3f) != uVar41) + (byte)lVar39;
                  pvVar6 = (Idx2->ChunksPerFile3s).Arr + uVar43;
                  (Idx2->ChunksPerFile3s).Arr[uVar43].field_0.field_3.XY.field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)0x100000001;
                  (Idx2->ChunksPerFile3s).Arr[uVar43].field_0.field_0.Z = 1;
                  uVar22 = (uint)(byte)BrickOrder[0x40];
                  iVar13 = -1;
                  for (; uVar23 != ChunksOrderInFile.Len; uVar23 = uVar23 + 1) {
                    iVar27 = (pbVar4[lVar42 + 0x80] - uVar22) + iVar13;
                    if (0x7f < iVar27) goto LAB_00152f79;
                    bVar11 = pbVar4[iVar27 + lVar42];
                    if (0x5a < (long)(char)bVar11) {
LAB_00152f9b:
                      __assert_fail("Idx < 3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                    ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
                    }
                    piVar40 = (int *)((long)pvVar6 + ((long)(char)bVar11 + -0x58) * 4);
                    *piVar40 = *piVar40 << 1;
                    iVar27 = (uint)ChunksOrderInFile.Len + iVar13;
                    if (0x3f < iVar27) goto LAB_00152f62;
                    ChunksOrderInFile.Data[iVar27] = bVar11;
                    iVar13 = iVar13 + -1;
                  }
                  F3.field_0.field_3.XY.field_0 = (v2<int>)&ChunksOrderInFile;
                  F3.field_0._8_4_ = uVar23;
                  uVar17 = EncodeTransformOrder((stref *)&F3);
                  (Idx2->ChunksOrderInFile).Arr[uVar43] = uVar17;
                  iVar13 = (pvVar6->field_0).field_0.X;
                  iVar27 = (pvVar6->field_0).field_0.Y;
                  iVar31 = (pvVar5->field_0).field_0.Z;
                  iVar29 = (pvVar6->field_0).field_0.Z;
                  psVar3->Arr[uVar43].field_0.field_3.XY.field_0 =
                       (anon_union_8_4_6ba14846_for_v2<int>_1)
                       ((long)((pvVar5->field_0).field_0.Y + iVar27 + -1) / (long)iVar27 << 0x20 |
                       (long)((pvVar5->field_0).field_0.X + -1 + iVar13) / (long)iVar13 &
                       0xffffffffU);
                  (Idx2->NFiles3).Arr[uVar43].field_0.field_0.Z = (iVar31 + iVar29 + -1) / iVar29;
                  F3.field_0.field_3.XY.field_0 =
                       (v2<int>)(anon_union_8_4_6ba14846_for_v2<int>_1)0x0;
                  F3.field_0._8_4_ = 0;
                  uStack_1cc = 0;
                  pbVar4 = (Idx2->BricksOrderStr).Buffer.Data;
                  uVar23 = (uint)(byte)BrickOrder[0x40];
                  uVar41 = (ulong)(1 << (pbVar4[lVar42 + 0x80] - BrickOrder[0x40] & 0x1f));
                  lVar39 = 0x3f;
                  if (uVar41 != 0) {
                    for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  iVar13 = -1;
                  Output_00 = psVar3;
                  for (uVar22 = 0;
                      uVar20 = (uint)(byte)((1L << ((byte)lVar39 & 0x3f) != uVar41) + (byte)lVar39),
                      uVar22 != uVar20; uVar22 = uVar22 + 1) {
                    iVar27 = (pbVar4[lVar42 + 0x80] - uVar23) + iVar13;
                    if (0x7f < iVar27) goto LAB_00152f79;
                    iVar31 = uVar20 + iVar13;
                    if (0x3f < iVar31) goto LAB_00152f62;
                    Output_00 = (stack_array<idx2::v3<int>,_16> *)
                                CONCAT71((int7)(int3)((uint)iVar27 >> 8),pbVar4[iVar27 + lVar42]);
                    *(byte *)((long)&F3.field_0 + (long)iVar31) = pbVar4[iVar27 + lVar42];
                    iVar13 = iVar13 + -1;
                  }
                  local_1e8.Ptr = (str)&F3;
                  local_1e0 = uVar22;
                  uVar17 = EncodeTransformOrder((stref *)&local_1e8);
                  (Idx2->ChunksOrder).Arr[uVar43] = uVar17;
                  Resize<idx2::stack_string<128>>(&Idx2->ChunksOrderStr,(long)Idx2->NLevels);
                  N3_01.field_0.field_0.Y = 0;
                  N3_01.field_0.field_0.X = (pvVar5->field_0).field_0.Z;
                  N3_01.field_0._8_4_ = SUB84((Idx2->ChunksOrderStr).Buffer.Data + lVar42,0);
                  bVar11 = DecodeTransformOrder
                                     ((idx2 *)(Idx2->ChunksOrder).Arr[uVar43],
                                      (u64)(pvVar5->field_0).field_3.XY.field_0,N3_01,(str)Output_00
                                     );
                  (Idx2->ChunksOrderStr).Buffer.Data[lVar42 + 0x80] = bVar11;
                  pbVar4 = (Idx2->BricksOrderStr).Buffer.Data;
                  uVar23 = (uint)ChunksOrderInFile.Len;
                  uVar22 = (uint)(byte)BrickOrder[0x40];
                  uVar41 = (ulong)(1 << (pbVar4[lVar42 + 0x80] - (char)(uVar23 + uVar22) & 0x1f));
                  lVar39 = 0x3f;
                  if (uVar41 != 0) {
                    for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                    }
                  }
                  FilesOrder.Len = (1L << ((byte)lVar39 & 0x3f) != uVar41) + (byte)lVar39;
                  iVar13 = -1;
                  for (uVar20 = 0; uVar20 != FilesOrder.Len; uVar20 = uVar20 + 1) {
                    iVar27 = ((uint)pbVar4[lVar42 + 0x80] - (uVar23 + uVar22)) + iVar13;
                    if (0x7f < iVar27) goto LAB_00152f79;
                    iVar31 = (uint)FilesOrder.Len + iVar13;
                    if (0x3f < iVar31) goto LAB_00152f62;
                    Output_00 = (stack_array<idx2::v3<int>,_16> *)
                                CONCAT71((int7)(int3)((uint)iVar27 >> 8),pbVar4[iVar27 + lVar42]);
                    FilesOrder.Data[iVar31] = pbVar4[iVar27 + lVar42];
                    iVar13 = iVar13 + -1;
                  }
                  F3.field_0.field_3.XY.field_0 = (v2<int>)&FilesOrder;
                  F3.field_0._8_4_ = uVar20;
                  uVar17 = EncodeTransformOrder((stref *)&F3);
                  (Idx2->FilesOrder).Arr[uVar43] = uVar17;
                  Resize<idx2::stack_string<128>>(&Idx2->FilesOrderStr,(long)Idx2->NLevels);
                  N3_02.field_0.field_0.Y = 0;
                  N3_02.field_0.field_0.X = psVar3->Arr[uVar43].field_0.field_0.Z;
                  N3_02.field_0._8_4_ = SUB84((Idx2->FilesOrderStr).Buffer.Data + lVar42,0);
                  bVar11 = DecodeTransformOrder
                                     ((idx2 *)(Idx2->FilesOrder).Arr[uVar43],
                                      (u64)psVar3->Arr[uVar43].field_0.field_3.XY.field_0,N3_02,
                                      (str)Output_00);
                  (Idx2->FilesOrderStr).Buffer.Data[lVar42 + 0x80] = bVar11;
                  uVar41 = (ulong)(byte)Idx2->NLevels;
                }
                *puVar1 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                ;
                uVar14 = 0x26e;
                uVar23 = 0;
              }
              else {
                uVar23 = 0x21;
                uVar14 = 0x219;
              }
            }
            else {
              uVar23 = 0x20;
              uVar14 = 0x217;
            }
          }
          else {
            uVar23 = 0x22;
            uVar14 = 0x215;
          }
        }
        else {
          uVar23 = 0x1f;
          uVar14 = 0x213;
        }
        *puVar2 = uVar14;
        if ((char)uVar23 == '\0') {
          if (Idx2->FilesPerDir < 0x1001) {
            for (uVar43 = 0; uVar43 != (uint)(int)(char)uVar41; uVar43 = uVar43 + 1) {
              if (uVar43 == 0x10) goto LAB_0015302c;
              uVar41 = (long)(Idx2->ChunksPerFile).Arr[uVar43] *
                       (long)(Idx2->BricksPerChunk).Arr[uVar43];
              (Idx2->BricksPerFile).Arr[uVar43] = (int)uVar41;
              Beg = (Idx2->FilesDirsDepth).Arr + uVar43;
              lVar39 = 0x3f;
              if (uVar41 != 0) {
                for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                }
              }
              bVar34 = -((int)uVar41 == 0) | (byte)lVar39;
              cVar12 = (1L << (bVar34 & 0x3f) != uVar41) + bVar34;
              (Idx2->FilesDirsDepth).Arr[uVar43].Len = '\x01';
              (Idx2->FilesDirsDepth).Arr[uVar43].Arr[0] = cVar12;
              bVar11 = (Idx2->BricksOrderStr).Buffer.Data[uVar43 * 0x81 + 0x80];
              for (; cVar35 = bVar11 - cVar12, cVar35 != '\0' && cVar12 <= (char)bVar11;
                  cVar12 = cVar12 + cVar35) {
                iVar13 = Idx2->FilesPerDir;
                uVar41 = (ulong)iVar13;
                bVar34 = Beg->Len;
                Beg->Len = bVar34 + 1;
                if (3 < (ulong)bVar34) {
                  pcVar45 = 
                  "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]"
                  ;
                  goto LAB_00153000;
                }
                lVar39 = 0x3f;
                if (uVar41 != 0) {
                  for (; uVar41 >> lVar39 == 0; lVar39 = lVar39 + -1) {
                  }
                }
                bVar19 = -(iVar13 == 0) | (byte)lVar39;
                cVar37 = (1L << (bVar19 & 0x3f) != uVar41) + bVar19;
                if (cVar37 < cVar35) {
                  cVar35 = cVar37;
                }
                Beg->Arr[bVar34] = cVar35;
              }
              if (4 < (ulong)Beg->Len) {
                *puVar1 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                ;
                *puVar2 = 0x285;
                uVar43 = 0x11b;
                pcVar45 = "";
                goto LAB_00152f4d;
              }
              Reverse<signed_char*>(Beg->Arr,Beg->Arr + Beg->Len);
              uVar41 = (ulong)(byte)Idx2->NLevels;
            }
            *puVar1 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
            ;
            *puVar2 = 0x28a;
            ComputeTransformDetails
                      (&Idx2->TransformDetails,&Idx2->BrickDimsExt3,1,Idx2->TransformOrder);
            iVar13 = (Idx2->BrickDims3).field_0.field_0.X;
            iVar27 = (Idx2->BrickDims3).field_0.field_0.Y;
            if (iVar27 < iVar13) {
              iVar27 = iVar13;
            }
            iVar13 = (Idx2->BrickDims3).field_0.field_0.Z;
            if (iVar27 <= iVar13) {
              iVar27 = iVar13;
            }
            lVar15 = 0x3f;
            if ((long)iVar27 != 0) {
              for (; (ulong)(long)iVar27 >> lVar15 == 0; lVar15 = lVar15 + -1) {
              }
            }
            uVar43 = 0;
            ComputeTransformDetails
                      (&Idx2->TransformDetailsExtrapolate,N3,-(uint)(iVar27 == 0) | (uint)lVar15,
                       Idx2->TransformOrder);
            *puVar1 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
            ;
            *puVar2 = 0x2f1;
LAB_00152c0d:
            pcVar45 = "";
          }
          else {
            *puVar1 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
            ;
            *puVar2 = 0x276;
            sVar51 = ToString(TooManyFilesPerDir);
            lVar39 = *in_FS_OFFSET;
            iVar13 = snprintf((char *)(lVar39 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                              (ulong)(uint)sVar51.Size,sVar51.field_0.Ptr,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                              ,0x276);
            pcVar45 = "%d";
            snprintf((char *)(lVar39 + -0xf80) + iVar13,0x400 - (long)iVar13,"%d",
                     (ulong)(uint)Idx2->FilesPerDir);
            uVar43 = 0x1011b;
LAB_00152f4d:
            *(undefined4 *)(lVar44 + -0x97c) = 0x2ed;
            *(char **)(lVar15 + -0xb78) =
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
            ;
          }
        }
        else {
          uVar43 = (ulong)(uVar23 | 0x100);
          *(undefined4 *)(lVar44 + -0x97c) = 0x2eb;
          *(char **)(lVar15 + -0xb78) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
          ;
        }
      }
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x2dd;
      sVar51 = ToString(TooManyLevels);
      lVar15 = *in_FS_OFFSET;
      iVar13 = snprintf((char *)(lVar15 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)sVar51.Size,sVar51.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                        ,0x2dd);
      pcVar45 = "Max # of levels = %d\n";
      snprintf((char *)(lVar15 + -0xf80) + iVar13,0x400 - (long)iVar13,"Max # of levels = %d\n",0x10
              );
      uVar43 = 0x10017;
    }
  }
  else {
    uVar43 = (ulong)(uVar23 | 0x100);
    *(undefined4 *)(*in_FS_OFFSET + -0x97c) = 0x2d8;
    *(char **)(*in_FS_OFFSET + -0xb78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
  }
  eVar52.Code = (char)uVar43;
  eVar52.StackIdx = (char)(uVar43 >> 8);
  eVar52.StrGened = (bool)(char)(uVar43 >> 0x10);
  eVar52._11_5_ = (int5)(uVar43 >> 0x18);
  eVar52.Msg = pcVar45;
  return eVar52;
LAB_00152f79:
  pcVar45 = "char &idx2::stack_string<128>::operator[](int) const [N = 128]";
  goto LAB_00152f8e;
LAB_0015302c:
  pcVar45 = "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]";
  goto LAB_00153000;
LAB_00152f62:
  pcVar45 = "char &idx2::stack_string<64>::operator[](int) const [N = 64]";
LAB_00152f8e:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x237,pcVar45);
LAB_00152fbd:
  pcVar45 = 
  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]";
LAB_00153000:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,pcVar45);
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file* Idx2, params* P)
{
  idx2_PropagateIfError(CheckBrickSize(Idx2, *P));
  P->Tolerance = Max(fabs(P->Tolerance), Idx2->Tolerance);
  //printf("tolerance = %.16f\n", P->Tolerance);
  GuessNumLevelsIfNeeded(Idx2);
  if (!(Idx2->NLevels <= idx2_file::MaxLevels))
    return idx2_Error(idx2_err_code::TooManyLevels, "Max # of levels = %d\n", Idx2->MaxLevels);
  if ((Idx2->BitPlanesPerChunk > Idx2->BitPlanesPerFile) ||
      (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk) != 0)
    return idx2_Error(idx2_err_code::SizeMismatched, "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");


  char TformOrder[8] = {};
  ComputeTransformOrder(Idx2, *P, TformOrder);

  BuildSubbands(Idx2, *P);

  ComputeNumBricksPerLevel(Idx2, *P);

  idx2_PropagateIfError(ComputeGlobalBricksOrder(Idx2, *P, TformOrder));
  idx2_PropagateIfError(ComputeLocalBricksChunksFilesOrders(Idx2, *P));

  idx2_PropagateIfError(ComputeFileDirDepths(Idx2, *P));

  ComputeWaveletTransformDetails(Idx2);

  return idx2_Error(idx2_err_code::NoError);
}